

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructReader * __thiscall
capnp::_::PointerReader::getStruct
          (StructReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  word *pwVar6;
  CapTableReader *pCVar7;
  int iVar8;
  undefined4 extraout_var;
  SegmentReader *pSVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  long lVar13;
  ulong uVar14;
  WirePointer *pWVar15;
  ulong uVar16;
  WirePointer *pWVar17;
  WirePointer *pWVar18;
  SegmentReader *pSVar9;
  undefined4 extraout_var_00;
  
  pWVar17 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar17 = this->pointer;
  }
  pSVar9 = this->segment;
  pWVar15 = pWVar17 + 1;
  lVar13 = (long)((int)*(uint64_t *)&(pWVar17->offsetAndKind).value >> 2);
  if (pSVar9 == (SegmentReader *)0x0) {
    pWVar12 = pWVar15 + lVar13;
  }
  else {
    pwVar6 = (pSVar9->ptr).ptr;
    pWVar12 = (WirePointer *)(pwVar6 + (pSVar9->ptr).size_);
    if (((long)pwVar6 - (long)pWVar15 >> 3 <= lVar13) &&
       (lVar13 <= (long)pWVar12 - (long)pWVar15 >> 3)) {
      pWVar12 = pWVar15 + lVar13;
    }
  }
  pCVar7 = this->capTable;
  iVar4 = this->nestingLimit;
  pWVar15 = (WirePointer *)defaultValue;
  if ((pWVar17->field_1).upper32Bits != 0 || (int)*(uint64_t *)&(pWVar17->offsetAndKind).value != 0)
  goto LAB_003ebe6c;
LAB_003ebe3c:
  do {
    do {
      while( true ) {
        if ((pWVar15 == (WirePointer *)0x0) ||
           (iVar8 = (int)*(uint64_t *)&(pWVar15->offsetAndKind).value,
           (pWVar15->field_1).upper32Bits == 0 && iVar8 == 0)) {
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->pointers = (WirePointer *)0x0;
          __return_storage_ptr__->segment = (SegmentReader *)0x0;
          __return_storage_ptr__->capTable = (CapTableReader *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
          __return_storage_ptr__->nestingLimit = 0x7fffffff;
          return __return_storage_ptr__;
        }
        pWVar12 = pWVar15 + (long)(iVar8 >> 2) + 1;
        pSVar9 = (SegmentReader *)0x0;
        defaultValue = (word *)0x0;
        pWVar17 = pWVar15;
LAB_003ebe6c:
        pWVar15 = (WirePointer *)defaultValue;
        if (0 < iVar4) break;
        getStruct();
      }
      pWVar18 = pWVar17;
      if ((pSVar9 != (SegmentReader *)0x0) &&
         ((*(uint64_t *)&(pWVar17->offsetAndKind).value & 3) == 2)) {
        iVar8 = (*pSVar9->arena->_vptr_Arena[2])
                          (pSVar9->arena,(ulong)(pWVar17->field_1).upper32Bits);
        pSVar9 = (SegmentReader *)CONCAT44(extraout_var,iVar8);
        if (pSVar9 == (SegmentReader *)0x0) {
          getStruct();
          pWVar12 = (WirePointer *)0x0;
        }
        else {
          uVar5 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
          uVar11 = (ulong)(uVar5 >> 3);
          uVar14 = (pSVar9->ptr).size_;
          if ((long)uVar14 < (long)uVar11) {
            uVar11 = uVar14;
          }
          uVar16 = 2 - (ulong)((uVar5 & 4) == 0);
          if (uVar11 + uVar16 <= uVar14) {
            pWVar18 = (WirePointer *)((pSVar9->ptr).ptr + uVar11);
            uVar14 = pSVar9->readLimiter->limit;
            if (uVar16 <= uVar14) {
              pSVar9->readLimiter->limit = uVar14 - uVar16;
              pWVar1 = pWVar18 + 1;
              if ((*(uint64_t *)&(pWVar17->offsetAndKind).value & 4) == 0) {
                lVar13 = (long)((int)*(uint64_t *)&(pWVar18->offsetAndKind).value >> 2);
                pwVar6 = (pSVar9->ptr).ptr;
                pWVar12 = (WirePointer *)(pwVar6 + (pSVar9->ptr).size_);
                if (((long)pwVar6 - (long)pWVar1 >> 3 <= lVar13) &&
                   (lVar13 <= (long)pWVar12 - (long)pWVar1 >> 3)) {
                  pWVar12 = pWVar1 + lVar13;
                }
              }
              else {
                iVar8 = (*pSVar9->arena->_vptr_Arena[2])
                                  (pSVar9->arena,(ulong)(pWVar18->field_1).upper32Bits);
                pSVar10 = (SegmentReader *)CONCAT44(extraout_var_00,iVar8);
                if (pSVar10 == (SegmentReader *)0x0) {
                  getStruct();
                  pWVar12 = (WirePointer *)0x0;
                  pWVar18 = pWVar1;
                }
                else {
                  uVar5 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
                  if ((uVar5 & 3) == 2) {
                    uVar11 = (ulong)(uVar5 >> 3);
                    uVar14 = (pSVar10->ptr).size_;
                    if ((long)uVar14 < (long)uVar11) {
                      uVar11 = uVar14;
                    }
                    pWVar12 = (WirePointer *)((pSVar10->ptr).ptr + uVar11);
                    pWVar18 = pWVar1;
                    pSVar9 = pSVar10;
                  }
                  else {
                    getStruct();
                    pWVar12 = (WirePointer *)0x0;
                    pWVar18 = pWVar1;
                  }
                }
              }
              goto LAB_003ebfc0;
            }
            (*pSVar9->arena->_vptr_Arena[3])();
          }
          getStruct();
          pWVar12 = (WirePointer *)0x0;
          pWVar18 = pWVar17;
        }
      }
LAB_003ebfc0:
    } while (pWVar12 == (WirePointer *)0x0);
    if ((*(uint64_t *)&(pWVar18->offsetAndKind).value & 3) == 0) {
      if (pSVar9 == (SegmentReader *)0x0) {
LAB_003ec01b:
        uVar2 = *(ushort *)&pWVar18->field_1;
        uVar3 = (pWVar18->field_1).structRef.ptrCount.value;
        __return_storage_ptr__->segment = pSVar9;
        __return_storage_ptr__->capTable = pCVar7;
        __return_storage_ptr__->data = pWVar12;
        __return_storage_ptr__->pointers = pWVar12 + uVar2;
        __return_storage_ptr__->dataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->pointerCount = uVar3;
        __return_storage_ptr__->nestingLimit = iVar4 + -1;
        return __return_storage_ptr__;
      }
      uVar14 = (ulong)(pWVar18->field_1).structRef.dataSize.value +
               (ulong)(pWVar18->field_1).structRef.ptrCount.value;
      if (((long)pWVar12 - (long)(pSVar9->ptr).ptr >> 3) + uVar14 <= (pSVar9->ptr).size_) {
        uVar11 = pSVar9->readLimiter->limit;
        if (uVar14 <= uVar11) {
          pSVar9->readLimiter->limit = uVar11 - uVar14;
          goto LAB_003ec01b;
        }
        (*pSVar9->arena->_vptr_Arena[3])();
      }
      getStruct();
      goto LAB_003ebe3c;
    }
    getStruct();
  } while( true );
}

Assistant:

StructReader PointerReader::getStruct(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readStructPointer(segment, capTable, ref, defaultValue, nestingLimit);
}